

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPIShmChain.cpp
# Opt level: O2

void __thiscall
adios2::aggregator::MPIShmChain::Init
          (MPIShmChain *this,size_t numAggregators,size_t subStreams,Comm *parentComm)

{
  Comm *this_00;
  Comm *this_01;
  Comm *this_02;
  ulong uVar1;
  uint uVar2;
  int iVar3;
  unsigned_long uVar4;
  ulong uVar5;
  ulong uVar6;
  MPIShmChain *pMVar7;
  MPIShmChain *this_03;
  float fVar8;
  allocator local_75;
  float local_74;
  HandshakeStruct hs;
  HandshakeStruct hsAC;
  
  if (this->PreInitCalled == false) {
    PreInit(this,parentComm);
  }
  this_00 = &this->m_NodeComm;
  local_74 = (float)helper::Comm::Rank(this_00);
  uVar2 = helper::Comm::Size(this_00);
  uVar1 = this->m_NumNodes;
  std::__cxx11::string::string((string *)&hsAC,"creating aggregator groups at Open",&local_75);
  uVar6 = (ulong)(int)uVar2;
  uVar5 = 1;
  if (uVar1 <= numAggregators) {
    uVar5 = numAggregators / uVar1;
  }
  if (uVar6 <= uVar5) {
    uVar5 = uVar6;
  }
  if ((long)uVar6 < 0) {
    fVar8 = (float)((ulong)(uVar2 & 1) | uVar6 >> 1);
    fVar8 = fVar8 + fVar8;
  }
  else {
    fVar8 = (float)(int)uVar2;
  }
  helper::Comm::Split((Comm *)&hs,(int)this_00,(int)((float)(int)local_74 / (fVar8 / (float)uVar5)),
                      (string *)0x0);
  this_01 = &(this->super_MPIAggregator).m_Comm;
  helper::Comm::operator=(this_01,(Comm *)&hs);
  helper::Comm::~Comm((Comm *)&hs);
  std::__cxx11::string::~string((string *)&hsAC);
  iVar3 = helper::Comm::Rank(this_01);
  (this->super_MPIAggregator).m_Rank = iVar3;
  iVar3 = helper::Comm::Size(this_01);
  (this->super_MPIAggregator).m_Size = iVar3;
  if ((this->super_MPIAggregator).m_Rank == 0) {
    iVar3 = helper::Comm::Rank(parentComm);
    (this->super_MPIAggregator).m_AggregatorRank = iVar3;
  }
  else {
    (this->super_MPIAggregator).m_IsAggregator = false;
    this->m_IsMasterAggregator = false;
  }
  iVar3 = helper::Comm::BroadcastValue<int>(this_01,&(this->super_MPIAggregator).m_AggregatorRank,0)
  ;
  (this->super_MPIAggregator).m_AggregatorRank = iVar3;
  iVar3 = (this->super_MPIAggregator).m_Rank;
  std::__cxx11::string::string((string *)&hsAC,"creating comm of all aggregators at Open",&local_75)
  ;
  helper::Comm::Split((Comm *)&hs,(int)parentComm,(uint)(iVar3 != 0),(string *)0x0);
  this_02 = &this->m_AllAggregatorsComm;
  helper::Comm::operator=(this_02,(Comm *)&hs);
  helper::Comm::~Comm((Comm *)&hs);
  std::__cxx11::string::~string((string *)&hsAC);
  if (local_74 == 0.0) {
    iVar3 = helper::Comm::Size(this_02);
    (this->super_MPIAggregator).m_NumAggregators = (long)iVar3;
  }
  uVar4 = helper::Comm::BroadcastValue<unsigned_long>
                    (this_00,&(this->super_MPIAggregator).m_NumAggregators,0);
  if (subStreams == 0) {
    subStreams = uVar4;
  }
  if (uVar4 <= subStreams) {
    subStreams = uVar4;
  }
  (this->super_MPIAggregator).m_NumAggregators = uVar4;
  (this->super_MPIAggregator).m_SubStreams = subStreams;
  if ((this->super_MPIAggregator).m_Rank == 0) {
    local_74 = (float)uVar4 / (float)subStreams;
    iVar3 = helper::Comm::Rank(this_02);
    (this->super_MPIAggregator).m_SubStreamIndex = (long)(int)((float)iVar3 / local_74);
  }
  uVar4 = helper::Comm::BroadcastValue<unsigned_long>
                    (this_01,&(this->super_MPIAggregator).m_SubStreamIndex,0);
  (this->super_MPIAggregator).m_SubStreamIndex = uVar4;
  std::__cxx11::string::string((string *)&hsAC,"creating chains of aggregators at Open",&local_75);
  helper::Comm::Split((Comm *)&hs,(int)this_02,(int)uVar4,(string *)0x0);
  this_03 = (MPIShmChain *)&this->m_AggregatorChainComm;
  helper::Comm::operator=((Comm *)this_03,(Comm *)&hs);
  helper::Comm::~Comm((Comm *)&hs);
  std::__cxx11::string::~string((string *)&hsAC);
  iVar3 = helper::Comm::Rank((Comm *)this_03);
  if (iVar3 != 0) {
    this->m_IsMasterAggregator = false;
  }
  HandshakeStruct::HandshakeStruct(&hsAC);
  pMVar7 = this_03;
  iVar3 = helper::Comm::Size((Comm *)this_03);
  if (1 < iVar3) {
    HandshakeLinks_Start(pMVar7,(Comm *)this_03,&hsAC);
  }
  (this->super_MPIAggregator).m_IsActive = true;
  iVar3 = helper::Comm::Size(this_01);
  if (1 < iVar3) {
    pMVar7 = (MPIShmChain *)&hs;
    HandshakeStruct::HandshakeStruct((HandshakeStruct *)pMVar7);
    HandshakeLinks_Start(pMVar7,this_01,&hs);
    HandshakeLinks_Complete(pMVar7,&hs);
    HandshakeStruct::~HandshakeStruct(&hs);
  }
  iVar3 = helper::Comm::Size((Comm *)this_03);
  if (1 < iVar3) {
    HandshakeLinks_Complete(this_03,&hsAC);
  }
  HandshakeStruct::~HandshakeStruct(&hsAC);
  return;
}

Assistant:

void MPIShmChain::Init(const size_t numAggregators, const size_t subStreams,
                       helper::Comm const &parentComm)
{
    if (!PreInitCalled)
    {
        PreInit(parentComm);
    }

    // int AllRank = parentComm.Rank();
    // int AllSize = parentComm.Size();
    int NodeRank = m_NodeComm.Rank();
    size_t NodeSize = static_cast<size_t>(m_NodeComm.Size());

    /* Number of aggregators per node */
    size_t aggregatorPerNode = numAggregators / m_NumNodes;
    if (aggregatorPerNode == 0)
    {
        aggregatorPerNode = 1; /* default */
    }
    if (aggregatorPerNode > NodeSize)
    {
        aggregatorPerNode = NodeSize;
    }

    /* Create main communicator that splits the node comm into one or more
     * aggregator chains */
    float k = static_cast<float>(NodeSize) / static_cast<float>(aggregatorPerNode);
    float c = static_cast<float>(NodeRank) / k;
    int color = static_cast<int>(c);
    m_Comm = m_NodeComm.Split(color, 0, "creating aggregator groups at Open");
    m_Rank = m_Comm.Rank();
    m_Size = m_Comm.Size();
    if (m_Rank != 0)
    {
        m_IsAggregator = false;
        m_IsMasterAggregator = false;
    }

    /* Identify parent rank of aggregator process within each chain */
    if (!m_Rank)
    {
        m_AggregatorRank = parentComm.Rank();
    }
    m_AggregatorRank = m_Comm.BroadcastValue<int>(m_AggregatorRank, 0);

    /* Communicator for all Aggregators */
    color = (m_Rank ? 1 : 0);
    m_AllAggregatorsComm = parentComm.Split(color, 0, "creating comm of all aggregators at Open");

    /* Total number of aggregators */
    if (!NodeRank)
    {
        m_NumAggregators = static_cast<size_t>(m_AllAggregatorsComm.Size());
    }
    m_NumAggregators = m_NodeComm.BroadcastValue<size_t>(m_NumAggregators);

    /* Number of substreams */
    m_SubStreams = subStreams;
    if (m_SubStreams == 0)
    {
        m_SubStreams = m_NumAggregators; /* default */
    }
    if (m_SubStreams > m_NumAggregators)
    {
        m_SubStreams = m_NumAggregators;
    }

    if (!m_Rank)
    {
        k = static_cast<float>(m_NumAggregators) / static_cast<float>(m_SubStreams);
        /* 1.0 <= k <= m_NumAggregators */
        c = static_cast<float>(m_AllAggregatorsComm.Rank()) / k;
        m_SubStreamIndex = static_cast<int>(c);
    }
    m_SubStreamIndex = m_Comm.BroadcastValue<size_t>(m_SubStreamIndex);

    /* Create the communicator to connect aggregators writing to the same
     * substream */
    color = static_cast<int>(m_SubStreamIndex);
    m_AggregatorChainComm =
        m_AllAggregatorsComm.Split(color, 0, "creating chains of aggregators at Open");

    if (m_AggregatorChainComm.Rank() != 0)
    {
        m_IsMasterAggregator = false;
    }
    HandshakeStruct hsAC; // need persistence until complete
    if (m_AggregatorChainComm.Size() > 1)
    {
        HandshakeLinks_Start(m_AggregatorChainComm, hsAC);
    }

    m_IsActive = true;

    if (m_Comm.Size() > 1)
    {
        HandshakeStruct hs; // need persistence until complete
        HandshakeLinks_Start(m_Comm, hs);

        /* Create the shared memory segment */
        // CreateShm();

        HandshakeLinks_Complete(hs);
    }

    if (m_AggregatorChainComm.Size() > 1)
    {
        HandshakeLinks_Complete(hsAC);
    }
}